

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O0

CosLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::mutable_cos(NeuralNetworkLayer *this)

{
  bool bVar1;
  CosLayerParams *this_00;
  NeuralNetworkLayer *this_local;
  
  bVar1 = has_cos(this);
  if (!bVar1) {
    clear_layer(this);
    set_has_cos(this);
    this_00 = (CosLayerParams *)operator_new(0x18);
    CosLayerParams::CosLayerParams(this_00);
    (this->layer_).cos_ = this_00;
  }
  return (CosLayerParams *)(this->layer_).convolution_;
}

Assistant:

inline ::CoreML::Specification::CosLayerParams* NeuralNetworkLayer::mutable_cos() {
  if (!has_cos()) {
    clear_layer();
    set_has_cos();
    layer_.cos_ = new ::CoreML::Specification::CosLayerParams;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.NeuralNetworkLayer.cos)
  return layer_.cos_;
}